

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpParser.cpp
# Opt level: O2

void __thiscall GrpParser::nameSpecStruct(GrpParser *this)

{
  RefAST *this_00;
  ASTFactory *nodes;
  RefAST RVar1;
  bool bVar2;
  int iVar3;
  ASTArray *pAVar4;
  NoViableAltException *pNVar5;
  AST *pAVar6;
  AST *pAVar7;
  AST *pAVar8;
  RefCount<Token> *this_01;
  AST *pAVar9;
  RefAST tmp72_AST;
  RefAST tmp70_AST;
  RefAST nameSpecStruct_AST;
  undefined1 local_e0 [8];
  RefAST tmp71_AST;
  RefAST X_AST;
  RefCount<AST> local_c8;
  RefAST N_AST;
  ASTFactory local_b8;
  RefCount<Token> local_a8;
  RefCount<Token> local_a0;
  RefToken I;
  RefToken N;
  ASTPair currentAST;
  RefAST local_70;
  RefAST local_68;
  RefAST local_60;
  RefToken local_58;
  RefToken local_50;
  RefToken local_48;
  RefCount<Token> local_40;
  RefCount<Token> local_38;
  
  this_00 = &(this->super_LLkParser).super_Parser.returnAST;
  RefCount<AST>::operator=(this_00,&nullAST);
  nameSpecStruct_AST = nullAST;
  currentAST.root.ref = (Ref *)0x0;
  currentAST.child.ref = (Ref *)0x0;
  if (nullAST.ref != (Ref *)0x0) {
    (nullAST.ref)->count = (nullAST.ref)->count + 1;
  }
  N.ref = nullToken.ref;
  if (nullToken.ref != (Ref *)0x0) {
    (nullToken.ref)->count = (nullToken.ref)->count + 1;
  }
  if (nameSpecStruct_AST.ref != (Ref *)0x0) {
    (nameSpecStruct_AST.ref)->count = (nameSpecStruct_AST.ref)->count + 1;
  }
  N_AST = nameSpecStruct_AST;
  if (N.ref != (Ref *)0x0) {
    (N.ref)->count = (N.ref)->count + 1;
  }
  I = N;
  if (nameSpecStruct_AST.ref != (Ref *)0x0) {
    (nameSpecStruct_AST.ref)->count = (nameSpecStruct_AST.ref)->count + 2;
  }
  local_c8.ref = nameSpecStruct_AST.ref;
  X_AST = nameSpecStruct_AST;
  iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
  if (iVar3 == 0xd) {
    (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&tmp70_AST,this,1);
    RefCount<Token>::operator=(&I,(RefCount<Token> *)&tmp70_AST);
    RefCount<Token>::~RefCount((RefCount<Token> *)&tmp70_AST);
    if (I.ref != (Ref *)0x0) {
      (I.ref)->count = (I.ref)->count + 1;
    }
    local_40.ref = I.ref;
    ASTFactory::create((ASTFactory *)&tmp70_AST,
                       (RefToken *)&(this->super_LLkParser).super_Parser.astFactory);
    RefCount<AST>::operator=(&local_c8,&tmp70_AST);
    RefCount<AST>::~RefCount(&tmp70_AST);
    this_01 = &local_40;
  }
  else {
    if (iVar3 != 0x11) {
      pNVar5 = (NoViableAltException *)__cxa_allocate_exception(0x40);
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_48,this,1);
      NoViableAltException::NoViableAltException(pNVar5,&local_48);
      __cxa_throw(pNVar5,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException
                 );
    }
    (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&tmp70_AST,this,1);
    RefCount<Token>::operator=(&N,(RefCount<Token> *)&tmp70_AST);
    RefCount<Token>::~RefCount((RefCount<Token> *)&tmp70_AST);
    if (N.ref != (Ref *)0x0) {
      (N.ref)->count = (N.ref)->count + 1;
    }
    local_38.ref = N.ref;
    ASTFactory::create((ASTFactory *)&tmp70_AST,
                       (RefToken *)&(this->super_LLkParser).super_Parser.astFactory);
    RefCount<AST>::operator=(&N_AST,&tmp70_AST);
    RefCount<AST>::~RefCount(&tmp70_AST);
    this_01 = &local_38;
  }
  RefCount<Token>::~RefCount(this_01);
  Parser::match((Parser *)this,iVar3);
  tmp70_AST = nullAST;
  if (nullAST.ref != (Ref *)0x0) {
    (nullAST.ref)->count = (nullAST.ref)->count + 1;
  }
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_a0,this,1);
  nodes = &(this->super_LLkParser).super_Parser.astFactory;
  ASTFactory::create((ASTFactory *)&tmp71_AST,(RefToken *)nodes);
  RefCount<AST>::operator=(&tmp70_AST,&tmp71_AST);
  RefCount<AST>::~RefCount(&tmp71_AST);
  RefCount<Token>::~RefCount(&local_a0);
  Parser::match((Parser *)this,0xb);
  iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
  if (iVar3 != 0xc) {
    if ((iVar3 != 0xd) && (iVar3 != 0x11)) {
      pNVar5 = (NoViableAltException *)__cxa_allocate_exception(0x40);
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_50,this,1);
      NoViableAltException::NoViableAltException(pNVar5,&local_50);
      __cxa_throw(pNVar5,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException
                 );
    }
    nameSpecList(this);
    RefCount<AST>::operator=(&X_AST,this_00);
  }
  tmp71_AST.ref = nullAST.ref;
  if (nullAST.ref != (Ref *)0x0) {
    (nullAST.ref)->count = (nullAST.ref)->count + 1;
  }
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_a8,this,1);
  ASTFactory::create((ASTFactory *)&tmp72_AST,(RefToken *)nodes);
  RefCount<AST>::operator=(&tmp71_AST,&tmp72_AST);
  RefCount<AST>::~RefCount(&tmp72_AST);
  RefCount<Token>::~RefCount(&local_a8);
  Parser::match((Parser *)this,0xc);
  iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
  if (iVar3 == 8) {
    iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
    bVar2 = BitSet::member(&_tokenSet_17,iVar3);
    if (!bVar2) goto LAB_0016cfff;
    iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,3);
    bVar2 = BitSet::member(&_tokenSet_4,iVar3);
    RVar1 = nullAST;
    if (!bVar2) goto LAB_0016cfff;
    if (nullAST.ref != (Ref *)0x0) {
      (nullAST.ref)->count = (nullAST.ref)->count + 1;
    }
    tmp72_AST = RVar1;
    (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_b8.nodeFactory,this,1);
    ASTFactory::create((ASTFactory *)local_e0,(RefToken *)nodes);
    RefCount<AST>::operator=(&tmp72_AST,(RefCount<AST> *)local_e0);
    RefCount<AST>::~RefCount((RefCount<AST> *)local_e0);
    RefCount<Token>::~RefCount((RefCount<Token> *)&local_b8.nodeFactory);
    Parser::match((Parser *)this,8);
    RefCount<AST>::~RefCount(&tmp72_AST);
  }
  else {
LAB_0016cfff:
    iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
    bVar2 = BitSet::member(&_tokenSet_17,iVar3);
    if (!bVar2) {
LAB_0016d287:
      pNVar5 = (NoViableAltException *)__cxa_allocate_exception(0x40);
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_58,this,1);
      NoViableAltException::NoViableAltException(pNVar5,&local_58);
      __cxa_throw(pNVar5,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException
                 );
    }
    iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
    bVar2 = BitSet::member(&_tokenSet_4,iVar3);
    if (!bVar2) goto LAB_0016d287;
    iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,3);
    bVar2 = BitSet::member(&_tokenSet_4,iVar3);
    if (!bVar2) goto LAB_0016d287;
  }
  RefCount<AST>::operator=(&nameSpecStruct_AST,&currentAST.root);
  pAVar4 = (ASTArray *)operator_new(0x20);
  ASTArray::ASTArray(pAVar4,4);
  ASTFactory::create(&local_b8,(int)nodes);
  pAVar4 = ASTArray::add(pAVar4,(RefAST *)&local_b8);
  if (N_AST.ref != (Ref *)0x0) {
    (N_AST.ref)->count = (N_AST.ref)->count + 1;
  }
  local_60.ref = N_AST.ref;
  pAVar4 = ASTArray::add(pAVar4,&local_60);
  if (local_c8.ref != (Ref *)0x0) {
    (local_c8.ref)->count = (local_c8.ref)->count + 1;
  }
  local_68.ref = local_c8.ref;
  pAVar4 = ASTArray::add(pAVar4,&local_68);
  if (X_AST.ref != (Ref *)0x0) {
    (X_AST.ref)->count = (X_AST.ref)->count + 1;
  }
  local_70.ref = X_AST.ref;
  ASTArray::add(pAVar4,&local_70);
  ASTFactory::make((ASTFactory *)&tmp72_AST,(ASTArray *)nodes);
  RefCount<AST>::operator=(&nameSpecStruct_AST,&tmp72_AST);
  RefCount<AST>::~RefCount(&tmp72_AST);
  RefCount<AST>::~RefCount(&local_70);
  RefCount<AST>::~RefCount(&local_68);
  RefCount<AST>::~RefCount(&local_60);
  RefCount<AST>::~RefCount((RefCount<AST> *)&local_b8);
  RefCount<AST>::operator=(&currentAST.root,&nameSpecStruct_AST);
  if (nameSpecStruct_AST.ref == (Ref *)0x0) {
    pAVar9 = (AST *)0x0;
  }
  else {
    pAVar9 = (nameSpecStruct_AST.ref)->ptr;
  }
  if (nullAST.ref == (Ref *)0x0) {
    pAVar8 = (AST *)0x0;
  }
  else {
    pAVar8 = (nullAST.ref)->ptr;
  }
  if (pAVar9 != pAVar8) {
    AST::getFirstChild((nameSpecStruct_AST.ref)->ptr);
    if (local_e0 == (undefined1  [8])0x0) {
      pAVar6 = (AST *)0x0;
    }
    else {
      pAVar6 = *(AST **)local_e0;
    }
    if (nullAST.ref == (Ref *)0x0) {
      pAVar7 = (AST *)0x0;
    }
    else {
      pAVar7 = (nullAST.ref)->ptr;
    }
    if (pAVar6 != pAVar7) {
      AST::getFirstChild((nameSpecStruct_AST.ref)->ptr);
      goto LAB_0016d1e0;
    }
  }
  if (nameSpecStruct_AST.ref != (Ref *)0x0) {
    (nameSpecStruct_AST.ref)->count = (nameSpecStruct_AST.ref)->count + 1;
  }
  tmp72_AST = nameSpecStruct_AST;
LAB_0016d1e0:
  RefCount<AST>::operator=(&currentAST.child,&tmp72_AST);
  RefCount<AST>::~RefCount(&tmp72_AST);
  if (pAVar9 != pAVar8) {
    RefCount<AST>::~RefCount((RefCount<AST> *)local_e0);
  }
  ASTPair::advanceChildToEnd(&currentAST);
  RefCount<AST>::~RefCount(&tmp71_AST);
  RefCount<AST>::~RefCount(&tmp70_AST);
  RefCount<AST>::operator=(this_00,&nameSpecStruct_AST);
  RefCount<AST>::~RefCount(&X_AST);
  RefCount<AST>::~RefCount(&local_c8);
  RefCount<Token>::~RefCount(&I);
  RefCount<AST>::~RefCount(&N_AST);
  RefCount<Token>::~RefCount(&N);
  RefCount<AST>::~RefCount(&nameSpecStruct_AST);
  ASTPair::~ASTPair(&currentAST);
  return;
}

Assistant:

void GrpParser::nameSpecStruct() {
	
	returnAST = nullAST;
	ASTPair currentAST;
	RefAST nameSpecStruct_AST = nullAST;
	RefToken  N = nullToken;
	RefAST N_AST = nullAST;
	RefToken  I = nullToken;
	RefAST I_AST = nullAST;
	RefAST X_AST = nullAST;
	
	try {      // for error handling
		{
		switch ( LA(1)) {
		case LIT_INT:
		{
			N = LT(1);
			N_AST = astFactory.create(N);
			match(LIT_INT);
			break;
		}
		case IDENT:
		{
			I = LT(1);
			I_AST = astFactory.create(I);
			match(IDENT);
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		RefAST tmp70_AST = nullAST;
		tmp70_AST = astFactory.create(LT(1));
		match(OP_LBRACE);
		{
		switch ( LA(1)) {
		case IDENT:
		case LIT_INT:
		{
			nameSpecList();
			X_AST = returnAST;
			break;
		}
		case OP_RBRACE:
		{
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		RefAST tmp71_AST = nullAST;
		tmp71_AST = astFactory.create(LT(1));
		match(OP_RBRACE);
		{
		if ((LA(1)==OP_SEMI) && (_tokenSet_17.member(LA(2))) && (_tokenSet_4.member(LA(3)))) {
			RefAST tmp72_AST = nullAST;
			tmp72_AST = astFactory.create(LT(1));
			match(OP_SEMI);
		}
		else if ((_tokenSet_17.member(LA(1))) && (_tokenSet_4.member(LA(2))) && (_tokenSet_4.member(LA(3)))) {
		}
		else {
			throw NoViableAltException(LT(1));
		}
		
		}
		nameSpecStruct_AST = currentAST.root;
		nameSpecStruct_AST = astFactory.make( (new ASTArray(4))->add(astFactory.create(ZdotStruct))->add(N_AST)->add(I_AST)->add(X_AST));
		currentAST.root = nameSpecStruct_AST;
		currentAST.child = nameSpecStruct_AST!=nullAST &&nameSpecStruct_AST->getFirstChild()!=nullAST ?
			nameSpecStruct_AST->getFirstChild() : nameSpecStruct_AST;
		currentAST.advanceChildToEnd();
	}
	catch (ParserException& ex) {
		reportError(ex);
		consume();
		consumeUntil(_tokenSet_17);
	}
	returnAST = nameSpecStruct_AST;
}